

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_node_set_raw * __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)5>_>
          (void *param_1,xpath_ast_node *param_2,undefined8 param_3,undefined8 *param_4,
          nodeset_eval_t param_5,undefined8 param_6,xpath_allocator *param_7,
          xpath_node_set_raw *param_8)

{
  bool bVar1;
  type_t tVar2;
  xpath_node *pxVar3;
  xpath_node *pxVar4;
  size_t sVar5;
  size_t size;
  xpath_node *it;
  xpath_node_set_raw s;
  bool once;
  type_t axis_type;
  nodeset_eval_t nStack000000000000006c;
  bool axis_reverse;
  axis_t axis;
  xpath_context *stack;
  xpath_ast_node *c;
  bool local_8a;
  bool local_89;
  undefined8 in_stack_ffffffffffffffa0;
  xpath_node *pxVar6;
  nodeset_eval_t eval;
  xpath_stack *in_stack_ffffffffffffffa8;
  xpath_node *in_stack_ffffffffffffffb0;
  xpath_node_set_raw *in_stack_ffffffffffffffb8;
  xpath_ast_node *in_stack_ffffffffffffffc0;
  
  eval = (nodeset_eval_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  if (param_2->_right == (xpath_ast_node *)0x0) {
    bVar1 = eval_once(type_sorted,param_5);
    local_89 = true;
    if (bVar1) goto LAB_00143856;
  }
  local_8a = false;
  if ((param_2->_right != (xpath_ast_node *)0x0) &&
     (local_8a = false, param_2->_right->_next == (xpath_ast_node *)0x0)) {
    local_8a = param_2->_right->_test == '\x03';
  }
  local_89 = local_8a;
LAB_00143856:
  xpath_node_set_raw::xpath_node_set_raw((xpath_node_set_raw *)param_1);
  xpath_node_set_raw::set_type((xpath_node_set_raw *)param_1,type_sorted);
  if (param_2->_left == (xpath_ast_node *)0x0) {
    step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)5>_>
              (param_2,param_1,param_3,*param_4,local_89);
    if (param_2->_right != (xpath_ast_node *)0x0) {
      apply_predicates(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                       (size_t)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,eval);
    }
  }
  else {
    eval_node_set(c,stack,_axis,nStack000000000000006c);
    pxVar3 = xpath_node_set_raw::begin((xpath_node_set_raw *)&stack0xffffffffffffffa8);
    while (pxVar6 = pxVar3,
          pxVar4 = xpath_node_set_raw::end((xpath_node_set_raw *)&stack0xffffffffffffffa8),
          pxVar3 != pxVar4) {
      sVar5 = xpath_node_set_raw::size((xpath_node_set_raw *)param_1);
      if (sVar5 != 0) {
        xpath_node_set_raw::set_type((xpath_node_set_raw *)param_1,type_unsorted);
      }
      step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)5>_>
                (param_2,param_1,pxVar6,*param_4,local_89);
      if (param_2->_right != (xpath_ast_node *)0x0) {
        apply_predicates(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                         (size_t)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                         (nodeset_eval_t)((ulong)pxVar6 >> 0x20));
      }
      pxVar3 = pxVar6 + 1;
    }
  }
  tVar2 = xpath_node_set_raw::type((xpath_node_set_raw *)param_1);
  if (tVar2 == type_unsorted) {
    xpath_node_set_raw::remove_duplicates(param_8,param_7);
  }
  return (xpath_node_set_raw *)param_1;
}

Assistant:

xpath_node_set_raw step_do(const xpath_context& c, const xpath_stack& stack, nodeset_eval_t eval, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_reverse = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_preceding || axis == axis_preceding_sibling);
			const xpath_node_set::type_t axis_type = axis_reverse ? xpath_node_set::type_sorted_reverse : xpath_node_set::type_sorted;

			bool once =
				(axis == axis_attribute && _test == nodetest_name) ||
				(!_right && eval_once(axis_type, eval)) ||
			    // coverity[mixed_enums]
				(_right && !_right->_next && _right->_test == predicate_constant_one);

			xpath_node_set_raw ns;
			ns.set_type(axis_type);

			if (_left)
			{
				xpath_node_set_raw s = _left->eval_node_set(c, stack, nodeset_eval_all);

				// self axis preserves the original order
				if (axis == axis_self) ns.set_type(s.type());

				for (const xpath_node* it = s.begin(); it != s.end(); ++it)
				{
					size_t size = ns.size();

					// in general, all axes generate elements in a particular order, but there is no order guarantee if axis is applied to two nodes
					if (axis != axis_self && size != 0) ns.set_type(xpath_node_set::type_unsorted);

					step_fill(ns, *it, stack.result, once, v);
					if (_right) apply_predicates(ns, size, stack, eval);
				}
			}
			else
			{
				step_fill(ns, c.n, stack.result, once, v);
				if (_right) apply_predicates(ns, 0, stack, eval);
			}

			// child, attribute and self axes always generate unique set of nodes
			// for other axis, if the set stayed sorted, it stayed unique because the traversal algorithms do not visit the same node twice
			if (axis != axis_child && axis != axis_attribute && axis != axis_self && ns.type() == xpath_node_set::type_unsorted)
				ns.remove_duplicates(stack.temp);

			return ns;
		}